

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

void test_bit_helpers(void)

{
  log_info("test_bit_helpers","\n");
  test_bit_check('\x02',2,'0');
  test_bit_check('\x02',1,'1');
  test_bit_check('\x02',0,'0');
  test_bit_check('\b',4,'0');
  test_bit_check('\b',3,'1');
  test_bit_check('\b',2,'0');
  test_bit_set_one('\b',0,'1');
  test_bit_set_one('\b',7,'1');
  test_bit_set_zero('\t',0,'0');
  test_bit_set_zero('\t',1,'0');
  test_bit_copy('\x02','\x01',1,3,2,'\t');
  test_bit_copy('\b','\x01',4,7,4,'A');
  return;
}

Assistant:

void test_bit_helpers() {
    log_info("test_bit_helpers", "\n");
    // 2 = 00000010
    test_bit_check(2, 2, BIT_0);
    test_bit_check(2, 1, BIT_1);
    test_bit_check(2, 0, BIT_0);

    // 8 = 00001000
    test_bit_check(8, 4, BIT_0);
    test_bit_check(8, 3, BIT_1);
    test_bit_check(8, 2, BIT_0);

    // 8 = 00001000
    test_bit_set_one(8, 0, BIT_1);
    test_bit_set_one(8, 7, BIT_1);

    // 9 = 00001001
    test_bit_set_zero(9, 0, BIT_0);
    test_bit_set_zero(9, 1, BIT_0);

    // source 2 = 0000 0010
    // dest   1 = 0000 0001
    // res    9 = 0000 1001
    // copy 10 from source to dest in pos 3
    test_bit_copy(0x02, 0x01, 1, 3, 2, 0x09);

    // source 2 = 0000 1000
    // dest   1 = 0000 0001
    // res    9 = 0100 0001
    // copy 0100 from source to dest in pos 7
    test_bit_copy(0x08, 0x01, 4, 7, 4, 0x41);
}